

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]> *this)

{
  QChar *pQVar1;
  QString *pQVar2;
  long lVar3;
  char16_t *__src;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  iterator d;
  QChar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (((this->a).b)->d).size + 0xc;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar4,Uninitialized);
  pQVar1 = (QChar *)(__return_storage_ptr__->d).ptr;
  QVar5.m_data = *(this->a).a;
  QVar5.m_size = 10;
  local_40 = pQVar1;
  QAbstractConcatenable::convertFromUtf8(QVar5,&local_40);
  pQVar2 = (this->a).b;
  lVar3 = (pQVar2->d).size;
  if (lVar3 != 0) {
    __src = (pQVar2->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(local_40,__src,lVar3 * 2);
  }
  local_40 = local_40 + lVar3;
  QVar6.m_data = *this->b;
  QVar6.m_size = 2;
  QAbstractConcatenable::convertFromUtf8(QVar6,&local_40);
  if (lVar4 != (long)local_40 - (long)pQVar1 >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }